

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O2

bool ApiDumpLayerWriteHtmlFooter(void)

{
  unique_lock<std::mutex> mlock;
  ofstream html_file;
  
  std::unique_lock<std::mutex>::unique_lock(&mlock,&g_record_mutex);
  std::ofstream::ofstream(&html_file);
  std::ofstream::open((string *)&html_file,0x281210);
  std::operator<<((ostream *)&html_file,"        </div>\n    </body>\n</html>");
  if (g_record_info.initialized == true) {
    g_record_info.initialized = false;
    g_record_info.type = RECORD_NONE;
  }
  std::ofstream::~ofstream(&html_file);
  std::unique_lock<std::mutex>::~unique_lock(&mlock);
  return true;
}

Assistant:

bool ApiDumpLayerWriteHtmlFooter() {
    try {
        std::unique_lock<std::mutex> mlock(g_record_mutex);
        std::ofstream html_file;
        html_file.open(g_record_info.file_name, std::ios::out | std::ios::app);
        html_file << "        </div>\n"
                     "    </body>\n"
                     "</html>";

        // Writing the footer means we're done.
        if (g_record_info.initialized) {
            g_record_info.initialized = false;
            g_record_info.type = RECORD_NONE;
        }

        return true;
    } catch (...) {
        return false;
    }
}